

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reoProfile.c
# Opt level: O1

void reoProfileWidthStart2(reo_man *p)

{
  short sVar1;
  uint uVar2;
  int iVar3;
  reo_plane *prVar4;
  reo_unit **pprVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  reo_unit *prVar9;
  long lVar10;
  int *piVar11;
  int iVar12;
  long lVar13;
  
  uVar2 = p->nSupp;
  uVar7 = (ulong)uVar2;
  if (-1 < (int)uVar2) {
    prVar4 = p->pPlanes;
    lVar10 = 0;
    do {
      *(undefined4 *)((long)&prVar4->statsWidth + lVar10) = 0;
      lVar10 = lVar10 + 0x38;
    } while (uVar7 * 0x38 + 0x38 != lVar10);
  }
  if (-1 < (int)uVar2) {
    prVar4 = p->pPlanes;
    lVar10 = 0;
    do {
      for (prVar9 = prVar4[lVar10].pHead; prVar9 != (reo_unit *)0x0; prVar9 = prVar9->Next) {
        prVar9->TopRef = 30000;
        prVar9->Sign = 0;
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 != uVar7 + 1);
  }
  iVar6 = p->nTops;
  if (0 < (long)iVar6) {
    pprVar5 = p->pTops;
    lVar10 = 0;
    do {
      *(undefined2 *)(((ulong)pprVar5[lVar10] & 0xfffffffffffffffe) + 2) = 0;
      lVar10 = lVar10 + 1;
    } while (iVar6 != lVar10);
  }
  if (0 < (int)uVar2) {
    prVar4 = p->pPlanes;
    uVar8 = 0;
    do {
      prVar9 = prVar4[uVar8].pHead;
      if (prVar9 != (reo_unit *)0x0) {
        lVar10 = uVar8 + 1;
        do {
          if (lVar10 < prVar9->pE->TopRef) {
            prVar9->pE->TopRef = (short)lVar10;
          }
          if (lVar10 < prVar9->pT->TopRef) {
            prVar9->pT->TopRef = (short)lVar10;
          }
          prVar9 = prVar9->Next;
        } while (prVar9 != (reo_unit *)0x0);
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 != uVar7);
  }
  uVar7 = (ulong)(uint)p->nSupp;
  if (0 < p->nSupp) {
    lVar13 = 0;
    lVar10 = 0;
    do {
      reoProfileWidthVerifyLevel((reo_plane *)((long)&p->pPlanes->fSifted + lVar13),(int)lVar10);
      lVar10 = lVar10 + 1;
      uVar7 = (ulong)p->nSupp;
      lVar13 = lVar13 + 0x38;
    } while (lVar10 < (long)uVar7);
  }
  iVar6 = (int)uVar7;
  if (0 < iVar6) {
    prVar4 = p->pPlanes;
    uVar8 = 0;
    do {
      for (prVar9 = prVar4[uVar8].pHead; prVar9 != (reo_unit *)0x0; prVar9 = prVar9->Next) {
        sVar1 = prVar9->TopRef;
        if (sVar1 <= prVar9->lev) {
          lVar10 = ((long)prVar9->lev - (long)sVar1) + 1;
          piVar11 = &prVar4[sVar1].statsWidth;
          do {
            *piVar11 = *piVar11 + 1;
            piVar11 = piVar11 + 0xe;
            lVar10 = lVar10 + -1;
          } while (lVar10 != 0);
        }
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 != (uVar7 & 0xffffffff));
  }
  prVar4 = p->pPlanes;
  prVar9 = prVar4[iVar6].pHead;
  if (prVar9 != (reo_unit *)0x0) {
    do {
      iVar12 = (int)prVar9->TopRef;
      if (iVar12 <= iVar6) {
        piVar11 = &prVar4[iVar12].statsWidth;
        iVar12 = (iVar6 + 1) - iVar12;
        do {
          *piVar11 = *piVar11 + 1;
          piVar11 = piVar11 + 0xe;
          iVar12 = iVar12 + -1;
        } while (iVar12 != 0);
      }
      prVar9 = prVar9->Next;
    } while (prVar9 != (reo_unit *)0x0);
  }
  p->nWidthCur = 0;
  if (-1 < iVar6) {
    iVar12 = p->nWidthCur;
    lVar10 = 0;
    do {
      iVar3 = *(int *)((long)&prVar4->statsWidth + lVar10);
      *(double *)((long)&prVar4->statsCost + lVar10) = (double)iVar3;
      iVar12 = iVar12 + iVar3;
      lVar10 = lVar10 + 0x38;
    } while ((ulong)(iVar6 + 1) * 0x38 - lVar10 != 0);
    p->nWidthCur = iVar12;
  }
  p->nWidthBeg = p->nWidthCur;
  return;
}

Assistant:

void reoProfileWidthStart2( reo_man * p )
{
    reo_unit * pUnit;
    int i, v;

    // clean the profile
    for ( i = 0; i <= p->nSupp; i++ )
        p->pPlanes[i].statsWidth = 0;
    
    // clean the node structures
    for ( v = 0; v <= p->nSupp; v++ )
    for ( pUnit = p->pPlanes[v].pHead; pUnit; pUnit = pUnit->Next )
    {
        pUnit->TopRef = REO_TOPREF_UNDEF;
        pUnit->Sign   = 0;
    }

    // set the topref to the topmost nodes
    for ( i = 0; i < p->nTops; i++ )
        Unit_Regular(p->pTops[i])->TopRef = 0;

    // go through the non-constant nodes and set the topmost level of their cofactors
    for ( i = 0; i < p->nSupp; i++ )
        for ( pUnit = p->pPlanes[i].pHead; pUnit; pUnit = pUnit->Next )
        {
            if ( pUnit->pE->TopRef > i+1 )
                 pUnit->pE->TopRef = i+1;
            if ( pUnit->pT->TopRef > i+1 )
                 pUnit->pT->TopRef = i+1;
        }

    // verify the top reference
    for ( i = 0; i < p->nSupp; i++ )
        reoProfileWidthVerifyLevel( p->pPlanes + i, i );

    // compute the profile for the internal nodes
    for ( i = 0; i < p->nSupp; i++ )
        for ( pUnit = p->pPlanes[i].pHead; pUnit; pUnit = pUnit->Next )
            for ( v = pUnit->TopRef; v <= pUnit->lev; v++ )
                p->pPlanes[v].statsWidth++;

    // compute the profile for the constant nodes
    for ( pUnit = p->pPlanes[p->nSupp].pHead; pUnit; pUnit = pUnit->Next )
        for ( v = pUnit->TopRef; v <= p->nSupp; v++ )
            p->pPlanes[v].statsWidth++;

    // get the width cost
    p->nWidthCur = 0;
    for ( i = 0; i <= p->nSupp; i++ )
    {
        p->pPlanes[i].statsCost = p->pPlanes[i].statsWidth;
        p->nWidthCur           += p->pPlanes[i].statsWidth;
    }
    p->nWidthBeg = p->nWidthCur;
}